

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<float> * __thiscall
cimg_library::CImg<float>::draw_image
          (CImg<float> *this,int x0,int y0,int z0,int c0,CImg<float> *sprite,float opacity)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int y;
  int iVar9;
  CImg<float> *pCVar10;
  float *pfVar11;
  int iVar12;
  long lVar13;
  int y_1;
  ulong uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  float *pfVar24;
  ulong uVar25;
  float *pfVar26;
  int iVar27;
  float *pfVar28;
  int local_b4;
  CImg<float> local_50;
  
  pfVar26 = this->_data;
  uVar22 = this->_width;
  uVar2 = this->_height;
  uVar3 = this->_depth;
  uVar4 = this->_spectrum;
  if ((uVar4 != 0 && ((uVar3 != 0 && uVar2 != 0) && (uVar22 != 0 && pfVar26 != (float *)0x0))) &&
     (pfVar28 = sprite->_data, pfVar28 != (float *)0x0)) {
    uVar25 = (ulong)uVar22;
    lVar13 = uVar2 * uVar25;
    uVar5 = sprite->_width;
    uVar14 = (ulong)uVar5;
    uVar6 = sprite->_height;
    uVar7 = sprite->_depth;
    uVar8 = sprite->_spectrum;
    if ((pfVar28 < pfVar26 + lVar13 * (ulong)uVar3 * (ulong)uVar4) &&
       (pfVar26 < pfVar28 + (ulong)uVar7 * (ulong)uVar8 * uVar6 * uVar14)) {
      CImg(&local_50,sprite,false);
      this = draw_image(this,x0,y0,z0,c0,&local_50,opacity);
      if ((local_50._is_shared == false) && (local_50._data != (float *)0x0)) {
        operator_delete__(local_50._data);
      }
    }
    else {
      if ((((((((y0 == 0 && x0 == 0) && z0 == 0) && c0 == 0) && (1.0 <= opacity)) &&
            (uVar22 == uVar5)) && ((uVar2 == uVar6 && (uVar3 == uVar7)))) && (uVar4 == uVar8)) &&
         (this->_is_shared == false)) {
        pCVar10 = assign<float>(this,sprite,false);
        return pCVar10;
      }
      iVar23 = 0;
      iVar12 = uVar22 - (uVar5 + x0);
      if ((int)(uVar5 + x0) <= (int)uVar22) {
        iVar12 = iVar23;
      }
      uVar22 = x0 >> 0x1f & x0;
      iVar27 = iVar12 + uVar5 + uVar22;
      iVar12 = uVar2 - (uVar6 + y0);
      if ((int)(uVar6 + y0) <= (int)uVar2) {
        iVar12 = iVar23;
      }
      iVar16 = uVar3 - (uVar7 + z0);
      if ((int)(uVar7 + z0) <= (int)uVar3) {
        iVar16 = iVar23;
      }
      iVar17 = uVar4 - (uVar8 + c0);
      if ((int)(uVar8 + c0) <= (int)uVar4) {
        iVar17 = iVar23;
      }
      if (0 < iVar27) {
        iVar12 = (y0 >> 0x1f & y0) + uVar6 + iVar12;
        if (0 < iVar12) {
          iVar16 = (z0 >> 0x1f & z0) + uVar7 + iVar16;
          if (0 < iVar16) {
            iVar17 = uVar8 + (c0 >> 0x1f & c0) + iVar17;
            if (0 < iVar17) {
              lVar15 = (long)iVar27;
              pfVar28 = pfVar28 + (((-(long)(int)(z0 >> 0x1f & uVar6 * uVar5 * z0) -
                                    (long)(int)(c0 >> 0x1f & uVar7 * c0 * uVar6 * uVar5)) -
                                   (long)(int)(y0 >> 0x1f & uVar5 * y0)) - (long)(int)uVar22);
              uVar20 = (ulong)(uint)x0;
              if (x0 < 1) {
                uVar20 = 0;
              }
              if (y0 < 1) {
                y0 = 0;
              }
              uVar18 = (ulong)(uint)z0;
              if (z0 < 1) {
                uVar18 = 0;
              }
              local_b4 = 0;
              uVar21 = (ulong)(uint)c0;
              if (c0 < 1) {
                uVar21 = 0;
              }
              pfVar26 = pfVar26 + uVar20 + (uint)y0 * uVar25 +
                                           uVar18 * lVar13 + lVar13 * (ulong)uVar3 * uVar21;
              do {
                iVar23 = 0;
                do {
                  if (1.0 <= opacity) {
                    iVar9 = 0;
                    do {
                      memcpy(pfVar26,pfVar28,lVar15 * 4);
                      pfVar26 = pfVar26 + this->_width;
                      pfVar28 = pfVar28 + sprite->_width;
                      iVar9 = iVar9 + 1;
                    } while (iVar9 < iVar12);
                  }
                  else {
                    iVar9 = 0;
                    do {
                      pfVar24 = pfVar28;
                      pfVar11 = pfVar26;
                      iVar19 = 0;
                      do {
                        fVar1 = *pfVar24;
                        pfVar24 = pfVar24 + 1;
                        *pfVar11 = fVar1 * ABS(opacity) +
                                   *pfVar11 *
                                   (1.0 - (float)(-(uint)(0.0 <= opacity) & (uint)opacity));
                        pfVar11 = pfVar11 + 1;
                        iVar19 = iVar19 + 1;
                      } while (iVar19 < iVar27);
                      iVar9 = iVar9 + 1;
                      pfVar26 = pfVar11 + (uVar25 - lVar15);
                      pfVar28 = pfVar24 + (uVar14 - lVar15);
                    } while (iVar9 < iVar12);
                    pfVar26 = pfVar11 + (uVar25 - lVar15);
                    pfVar28 = pfVar24 + (uVar14 - lVar15);
                  }
                  pfVar26 = pfVar26 + (uVar2 - iVar12) * uVar25;
                  pfVar28 = pfVar28 + (uVar6 - iVar12) * uVar14;
                  iVar23 = iVar23 + 1;
                } while (iVar23 < iVar16);
                pfVar26 = pfVar26 + (ulong)(uVar3 - iVar16) * lVar13;
                pfVar28 = pfVar28 + uVar6 * uVar14 * (ulong)(uVar7 - iVar16);
                local_b4 = local_b4 + 1;
              } while (local_b4 < iVar17);
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_image(const int x0, const int y0, const int z0, const int c0,
                        const CImg<T>& sprite, const float opacity=1) {
      if (is_empty() || !sprite) return *this;
      if (is_overlapped(sprite)) return draw_image(x0,y0,z0,c0,+sprite,opacity);
      if (x0==0 && y0==0 && z0==0 && c0==0 && is_sameXYZC(sprite) && opacity>=1 && !is_shared()) return assign(sprite,false);
      const bool bx = (x0<0), by = (y0<0), bz = (z0<0), bc = (c0<0);
      const int
        lX = sprite.width() - (x0 + sprite.width()>width()?x0 + sprite.width() - width():0) + (bx?x0:0),
        lY = sprite.height() - (y0 + sprite.height()>height()?y0 + sprite.height() - height():0) + (by?y0:0),
        lZ = sprite.depth() - (z0 + sprite.depth()>depth()?z0 + sprite.depth() - depth():0) + (bz?z0:0),
        lC = sprite.spectrum() - (c0 + sprite.spectrum()>spectrum()?c0 + sprite.spectrum() - spectrum():0) + (bc?c0:0);
      const T
        *ptrs = sprite._data -
        (bx?x0:0) -
        (by?y0*sprite.width():0) -
        (bz?z0*sprite.width()*sprite.height():0) -
        (bc?c0*sprite.width()*sprite.height()*sprite.depth():0);
      const unsigned long
        offX = (unsigned long)_width - lX,
        soffX = (unsigned long)sprite._width - lX,
        offY = (unsigned long)_width*(_height - lY),
        soffY = (unsigned long)sprite._width*(sprite._height - lY),
        offZ = (unsigned long)_width*_height*(_depth - lZ),
        soffZ = (unsigned long)sprite._width*sprite._height*(sprite._depth - lZ),
        slX = lX*sizeof(T);
      const float nopacity = cimg::abs(opacity), copacity = 1 - cimg::max(opacity,0);
      if (lX>0 && lY>0 && lZ>0 && lC>0) {
        T *ptrd = data(x0<0?0:x0,y0<0?0:y0,z0<0?0:z0,c0<0?0:c0);
        for (int v = 0; v<lC; ++v) {
          for (int z = 0; z<lZ; ++z) {
            if (opacity>=1) for (int y = 0; y<lY; ++y) { std::memcpy(ptrd,ptrs,slX); ptrd+=_width; ptrs+=sprite._width; }
            else for (int y = 0; y<lY; ++y) {
                for (int x = 0; x<lX; ++x) { *ptrd = (T)(nopacity*(*(ptrs++)) + *ptrd*copacity); ++ptrd; }
                ptrd+=offX; ptrs+=soffX;
              }
            ptrd+=offY; ptrs+=soffY;
          }
          ptrd+=offZ; ptrs+=soffZ;
        }
      }
      return *this;
    }